

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * getTime_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator local_79;
  char local_78 [8];
  char buffer [80];
  tm *timeinfo;
  time_t rawtime;
  
  time((time_t *)&timeinfo);
  __tp = localtime((time_t *)&timeinfo);
  strftime(local_78,0x50,"%d-%m-%Y %I:%M:%S",__tp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_78,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return in_RDI;
}

Assistant:

String getTime(){
    time_t rawtime;
    struct tm * timeinfo;
    char buffer[80];

    time (&rawtime);
    timeinfo = localtime(&rawtime);

    strftime(buffer,sizeof(buffer),"%d-%m-%Y %I:%M:%S",timeinfo);
    return String(buffer);
}